

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O1

float stbir__filter_trapezoid(float x,float scale)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  if (scale <= 1.0) {
    fVar2 = ABS(x);
    fVar4 = scale * 0.5 + 0.5;
    fVar3 = 0.0;
    if (fVar2 < fVar4) {
      uVar1 = -(uint)(0.5 - scale * 0.5 < fVar2);
      fVar3 = (float)(~uVar1 & 0x3f800000 | (uint)((fVar4 - fVar2) / scale) & uVar1);
    }
    return fVar3;
  }
  __assert_fail("scale <= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                ,0x2fb,"float stbir__filter_trapezoid(float, float)");
}

Assistant:

static float stbir__filter_trapezoid(float x, float scale)
{
    float halfscale = scale / 2;
    float t = 0.5f + halfscale;
    STBIR_ASSERT(scale <= 1);

    x = (float)fabs(x);

    if (x >= t)
        return 0;
    else
    {
        float r = 0.5f - halfscale;
        if (x <= r)
            return 1;
        else
            return (t - x) / scale;
    }
}